

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<UncompressedRow>::data(QList<UncompressedRow> *this)

{
  QArrayDataPointer<UncompressedRow> *this_00;
  UncompressedRow *pUVar1;
  QArrayDataPointer<UncompressedRow> *in_RDI;
  
  detach((QList<UncompressedRow> *)0x10611c);
  this_00 = (QArrayDataPointer<UncompressedRow> *)
            QArrayDataPointer<UncompressedRow>::operator->(in_RDI);
  pUVar1 = QArrayDataPointer<UncompressedRow>::data(this_00);
  return pUVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }